

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O0

void __thiscall SourceMapTest_Fibonacci_Test::TestBody(SourceMapTest_Fibonacci_Test *this)

{
  ulong location;
  bool bVar1;
  char *message;
  char *in_R9;
  optional<unsigned_int> local_11c;
  optional<unsigned_int> local_110;
  optional<unsigned_int> local_104;
  optional<unsigned_int> local_f8;
  optional<unsigned_int> local_ec;
  optional<unsigned_int> local_e0;
  optional<unsigned_int> local_d4;
  _Optional_payload_base<unsigned_int> local_c8;
  ulong local_c0;
  size_t l;
  optional<unsigned_int> local_b0;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  optional<wasm::Function::DebugLocation> loc;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string sourceMap;
  SourceMapTest_Fibonacci_Test *this_local;
  
  sourceMap.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "\n    {\n      \"version\":3,\n      \"sources\":[\"fib.c\"],\n      \"names\":[],\n      \"mappings\": \"moBAEA,4BAKA,QAJA,OADA,OAAA,uCAKA\"\n    }\n  "
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  SourceMapTest::parseMap(&this->super_SourceMapTest,(string *)local_30);
  std::unique_ptr<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>::operator->
            (&(this->super_SourceMapTest).reader);
  ::wasm::SourceMapReader::readDebugLocationAt
            ((ulong)((long)&gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_71 = std::optional<wasm::Function::DebugLocation>::has_value
                       ((optional<wasm::Function::DebugLocation> *)
                        ((long)&gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 4));
  local_71 = !local_71;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_70,(AssertionResult *)"loc.has_value()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0xb2,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::optional<unsigned_int>::optional(&local_b0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x283,0,3,0,local_b0);
  for (local_c0 = 0x284; location = local_c0, local_c0 < 0x29f; local_c0 = local_c0 + 1) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_c8);
    SourceMapTest::ExpectDbgLocEq
              (&this->super_SourceMapTest,location,0,3,0,(optional<unsigned_int>)local_c8);
  }
  std::optional<unsigned_int>::optional(&local_d4);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x29f,0,8,0,local_d4);
  std::optional<unsigned_int>::optional(&local_e0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2a7,0,4,0,local_e0);
  std::optional<unsigned_int>::optional(&local_ec);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2ae,0,3,0,local_ec);
  std::optional<unsigned_int>::optional(&local_f8);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2b5,0,3,0,local_f8);
  std::optional<unsigned_int>::optional(&local_104);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2dc,0,8,0,local_104);
  std::optional<unsigned_int>::optional(&local_110);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2dd,0,8,0,local_110);
  std::optional<unsigned_int>::optional(&local_11c);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,9999,0,8,0,local_11c);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(SourceMapTest, Fibonacci) {
  // Test mapping parsing and debug locs
  std::string sourceMap = R"(
    {
      "version":3,
      "sources":["fib.c"],
      "names":[],
      "mappings": "moBAEA,4BAKA,QAJA,OADA,OAAA,uCAKA"
    }
  )";
  parseMap(sourceMap);

  // Location before the first record has no value
  auto loc = reader->readDebugLocationAt(642);
  EXPECT_FALSE(loc.has_value());

  // TODO: These column numbers show as 0 but emsymbolizer.py prints them as 1.
  // Figure out which is right.
  // First location
  ExpectDbgLocEq(643, 0, 3, 0, std::nullopt);
  // locations in between records have the same value as the previous one.
  for (size_t l = 644; l < 671; l++) {
    ExpectDbgLocEq(l, 0, 3, 0, std::nullopt);
  }
  // Subsequent ones are on record boundaries
  ExpectDbgLocEq(671, 0, 8, 0, std::nullopt);
  ExpectDbgLocEq(679, 0, 4, 0, std::nullopt);
  ExpectDbgLocEq(686, 0, 3, 0, std::nullopt);
  ExpectDbgLocEq(693, 0, 3, 0, std::nullopt);
  ExpectDbgLocEq(732, 0, 8, 0, std::nullopt);
  // Entries after the last record have the same value as the last one.
  ExpectDbgLocEq(733, 0, 8, 0, std::nullopt);
  // Should we return empty values for locations that are past the end of the
  // program?
  ExpectDbgLocEq(9999, 0, 8, 0, std::nullopt);
}